

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes)

{
  int iVar1;
  mz_bool mVar2;
  FILE *__stream;
  time_t file_modified_time;
  mz_uint64 local_c8;
  stat64 local_c0;
  
  file_modified_time = 0;
  iVar1 = stat64(pSrc_filename,&local_c0);
  if (iVar1 == 0) {
    file_modified_time = local_c0.st_mtim.tv_sec;
    __stream = fopen64(pSrc_filename,"rb");
    if (__stream == (FILE *)0x0) {
      mVar2 = 0;
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
      }
    }
    else {
      fseeko64(__stream,0,2);
      local_c8 = ftello64(__stream);
      fseeko64(__stream,0,0);
      mVar2 = mz_zip_writer_add_read_buf_callback
                        (pZip,pArchive_name,mz_file_read_func_stdio,__stream,local_c8,
                         &file_modified_time,pComment,comment_size,level_and_flags,ext_attributes,
                         (char *)0x0,0,(char *)0x0,0);
      fclose(__stream);
    }
  }
  else {
    mVar2 = 0;
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_FILE_STAT_FAILED;
      mVar2 = 0;
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size, mz_uint level_and_flags,
                               mz_uint32 ext_attributes) {
  MZ_FILE *pSrc_file = NULL;
  mz_uint64 uncomp_size = 0;
  MZ_TIME_T file_modified_time;
  MZ_TIME_T *pFile_time = NULL;
  mz_bool status;

  memset(&file_modified_time, 0, sizeof(file_modified_time));

#if !defined(MINIZ_NO_TIME) && !defined(MINIZ_NO_STDIO)
  pFile_time = &file_modified_time;
  if (!mz_zip_get_file_modified_time(pSrc_filename, &file_modified_time))
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_STAT_FAILED);
#endif

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  status = mz_zip_writer_add_cfile(
      pZip, pArchive_name, pSrc_file, uncomp_size, pFile_time, pComment,
      comment_size, level_and_flags, ext_attributes, NULL, 0, NULL, 0);

  MZ_FCLOSE(pSrc_file);

  return status;
}